

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis<double,unsigned_long,double>
                 (size_t col_num,size_t nrows,double *Xc,unsigned_long *Xc_ind,
                 unsigned_long *Xc_indptr,MissingAction missing_action)

{
  ulong uVar1;
  bool bVar2;
  unsigned_long ix;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double __z;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_98;
  size_t local_80;
  
  uVar3 = Xc_indptr[col_num];
  uVar1 = Xc_indptr[col_num + 1];
  if (1 < nrows && uVar3 != uVar1) {
    local_80 = nrows;
    if (missing_action == Fail) {
      __z = 0.0;
      local_98 = 0.0;
      dVar7 = 0.0;
      dVar8 = 0.0;
      if (uVar3 < uVar1) {
        local_98 = 0.0;
        do {
          dVar9 = Xc[uVar3];
          dVar6 = dVar9 * dVar9;
          dVar8 = dVar8 + dVar9;
          dVar7 = fma(dVar9,dVar9,dVar7);
          local_98 = fma(dVar6,dVar9,local_98);
          __z = fma(dVar6,dVar6,__z);
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
    }
    else {
      __z = 0.0;
      local_98 = 0.0;
      dVar7 = 0.0;
      dVar8 = 0.0;
      uVar4 = uVar3;
      if (uVar3 < uVar1) {
        do {
          dVar9 = Xc[uVar4];
          if ((ulong)ABS(dVar9) < 0x7ff0000000000000) {
            dVar6 = dVar9 * dVar9;
            dVar8 = dVar8 + dVar9;
            dVar7 = fma(dVar9,dVar9,dVar7);
            local_98 = fma(dVar6,dVar9,local_98);
            __z = fma(dVar6,dVar6,__z);
          }
          else {
            local_80 = local_80 - 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      if (local_80 <= (uVar3 + nrows) - uVar1) {
        return -INFINITY;
      }
    }
    if ((1 < local_80) && ((dVar7 != 0.0 || (NAN(dVar7))))) {
      if ((dVar7 != dVar8 * dVar8) || (NAN(dVar7) || NAN(dVar8 * dVar8))) {
        auVar5._8_4_ = (int)(local_80 >> 0x20);
        auVar5._0_8_ = local_80;
        auVar5._12_4_ = 0x45300000;
        dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_80) - 4503599627370496.0);
        dVar11 = dVar8 / dVar6;
        dVar9 = dVar11 * dVar11;
        dVar10 = dVar7 / dVar6 - dVar9;
        if ((!NAN(dVar10)) &&
           ((2.220446049250313e-16 < dVar10 ||
            (bVar2 = check_more_than_two_unique_values<double,unsigned_long>
                               (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar2)))) {
          if (dVar10 <= 0.0) {
            return 0.0;
          }
          dVar7 = (dVar9 * dVar11 * dVar11 * dVar6 +
                  dVar8 * -4.0 * dVar9 * dVar11 +
                  dVar7 * 6.0 * dVar9 + local_98 * -4.0 * dVar11 + __z) / (dVar10 * dVar10 * dVar6);
          if ((long)ABS(dVar7) < 0x7ff0000000000000) {
            if (dVar7 <= 0.0) {
              return 0.0;
            }
            return dVar7;
          }
          return -INFINITY;
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis(size_t col_num, size_t nrows,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = nrows;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            if (unlikely(is_na_or_inf(xval)))
            {
                cnt--;
            }

            else
            {
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);
            }
        }

        if (cnt <= (nrows) - (Xc_indptr[col_num+1] - Xc_indptr[col_num])) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            x_sq = square(xval);
            s1 += xval;
            s2  = std::fma(xval, xval, s2);
            s3  = std::fma(x_sq, xval, s3);
            s4  = std::fma(x_sq, x_sq, s4);
            // s1 += pw1(xval);
            // s2 += pw2(xval);
            // s3 += pw3(xval);
            // s4 += pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}